

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cpp
# Opt level: O0

PSNodesSeq * __thiscall
dg::pta::LLVMPointerGraphBuilder::createGEP(LLVMPointerGraphBuilder *this,Instruction *Inst)

{
  bool bVar1;
  ret_type args;
  type tVar2;
  APInt *pAVar3;
  ulong uVar4;
  APInt *pAVar5;
  PSNodesSeq *pPVar6;
  PSNode *in_RDI;
  uint64_t off;
  PSNode *op;
  PSNode *node;
  APInt offset;
  uint bitwidth;
  Value *ptrOp;
  GetElementPtrInst *GEP;
  APInt *in_stack_ffffffffffffff88;
  uint N;
  APInt *in_stack_ffffffffffffff90;
  LLVMPointerGraphBuilder *in_stack_ffffffffffffff98;
  Value *in_stack_ffffffffffffffa8;
  APInt *in_stack_ffffffffffffffb0;
  PSNode *local_40;
  
  args = llvm::cast<llvm::GetElementPtrInst,llvm::Instruction_const>((Instruction *)0x1b70c2);
  llvm::GetElementPtrInst::getPointerOperand((GetElementPtrInst *)0x1b70d1);
  llvm::Module::getDataLayout();
  llvmutils::getPointerBitwidth((DataLayout *)in_RDI,(Value *)in_stack_ffffffffffffff98);
  llvm::APInt::APInt((APInt *)in_RDI,(uint)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                     (uint64_t)in_stack_ffffffffffffff90,
                     SUB81((ulong)in_stack_ffffffffffffff88 >> 0x38,0));
  local_40 = (PSNode *)0x0;
  getOperand(in_stack_ffffffffffffff98,(Value *)in_stack_ffffffffffffff90);
  tVar2 = Offset::operator*((Offset *)&in_RDI[1].super_SubgraphNode<dg::pta::PSNode>.data);
  if (tVar2 != 0) {
    pAVar3 = (APInt *)llvm::Module::getDataLayout();
    uVar4 = llvm::GetElementPtrInst::accumulateConstantOffset((DataLayout *)args,pAVar3);
    in_stack_ffffffffffffff98 = (LLVMPointerGraphBuilder *)args;
    if ((uVar4 & 1) != 0) {
      bVar1 = llvm::APInt::isIntN(in_stack_ffffffffffffff90,
                                  (uint)((ulong)in_stack_ffffffffffffff88 >> 0x20));
      if (bVar1) {
        Offset::operator*((Offset *)&in_RDI[1].super_SubgraphNode<dg::pta::PSNode>.data);
        pAVar3 = (APInt *)llvm::APInt::getLimitedValue((APInt *)in_RDI,(uint64_t)args);
        in_stack_ffffffffffffffb0 = pAVar3;
        if ((pAVar3 == (APInt *)0x0) ||
           (pAVar5 = (APInt *)Offset::operator*((Offset *)
                                                &in_RDI[1].super_SubgraphNode<dg::pta::PSNode>.data)
           , in_stack_ffffffffffffff90 = pAVar3,
           in_stack_ffffffffffffff98 = (LLVMPointerGraphBuilder *)args, pAVar3 < pAVar5)) {
          in_stack_ffffffffffffffa8 = (Value *)llvm::APInt::getZExtValue(in_stack_ffffffffffffff88);
          local_40 = PointerGraph::create<(dg::pta::PSNodeType)4,dg::pta::PSNode*&,unsigned_long>
                               ((PointerGraph *)in_RDI,(PSNode **)args,
                                (unsigned_long *)in_stack_ffffffffffffff90);
          in_stack_ffffffffffffff98 = (LLVMPointerGraphBuilder *)args;
        }
      }
      else {
        llvm::errs();
        N = (uint)((ulong)in_stack_ffffffffffffff88 >> 0x20);
        llvm::raw_ostream::operator<<((raw_ostream *)in_RDI,(char *)args);
        llvm::raw_ostream::operator<<((raw_ostream *)in_stack_ffffffffffffff90,N);
        llvm::raw_ostream::operator<<((raw_ostream *)in_RDI,(char *)args);
        in_stack_ffffffffffffff98 = (LLVMPointerGraphBuilder *)args;
      }
    }
  }
  if (local_40 == (PSNode *)0x0) {
    PointerGraph::create<(dg::pta::PSNodeType)4,dg::pta::PSNode*&,unsigned_long_const&>
              ((PointerGraph *)in_RDI,(PSNode **)in_stack_ffffffffffffff98,
               (unsigned_long *)in_stack_ffffffffffffff90);
  }
  pPVar6 = addNode((LLVMPointerGraphBuilder *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                   in_RDI);
  llvm::APInt::~APInt(in_stack_ffffffffffffff90);
  return pPVar6;
}

Assistant:

LLVMPointerGraphBuilder::PSNodesSeq &
LLVMPointerGraphBuilder::createGEP(const llvm::Instruction *Inst) {
    using namespace llvm;

    const GetElementPtrInst *GEP = cast<GetElementPtrInst>(Inst);
    const Value *ptrOp = GEP->getPointerOperand();
    unsigned bitwidth =
            llvmutils::getPointerBitwidth(&M->getDataLayout(), ptrOp);
    APInt offset(bitwidth, 0);

    PSNode *node = nullptr;
    PSNode *op = getOperand(ptrOp);

    if (*_options.fieldSensitivity > 0 &&
        GEP->accumulateConstantOffset(M->getDataLayout(), offset)) {
        // is offset in given bitwidth?
        if (offset.isIntN(bitwidth)) {
            // is 0 < offset < field_sensitivity ?
            uint64_t off = offset.getLimitedValue(*_options.fieldSensitivity);
            if (off == 0 || off < *_options.fieldSensitivity)
                node = PS.create<PSNodeType::GEP>(op, offset.getZExtValue());
        } else
            errs() << "WARN: GEP offset greater than " << bitwidth << "-bit";
        // fall-through to Offset::UNKNOWN in this case
    }

    // we didn't create the node with concrete offset,
    // in which case we are supposed to create a node
    // with Offset::UNKNOWN
    if (!node)
        node = PS.create<PSNodeType::GEP>(op, Offset::UNKNOWN);

    assert(node);

    return addNode(Inst, node);
}